

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int yy_find_shift_action(yyParser *pParser,uchar iLookAhead)

{
  uint uVar1;
  int iVar2;
  int j;
  uchar iFallback;
  int stateno;
  int i;
  uchar iLookAhead_local;
  yyParser *pParser_local;
  
  uVar1 = (uint)pParser->yystack[pParser->yyidx].stateno;
  if ((uVar1 < 0x1a1) && (yy_shift_ofst[(int)uVar1] != -0x46)) {
    iVar2 = (uint)iLookAhead + (int)yy_shift_ofst[(int)uVar1];
    if (((iVar2 < 0) || (0x61b < iVar2)) || (yy_lookahead[iVar2] != iLookAhead)) {
      if (iLookAhead != '\0') {
        if ((iLookAhead < 0x43) && (""[iLookAhead] != '\0')) {
          iVar2 = yy_find_shift_action(pParser,""[iLookAhead]);
          return iVar2;
        }
        iVar2 = (iVar2 - (uint)iLookAhead) + 0x43;
        if ((-1 < iVar2) && (yy_lookahead[iVar2] == 'C')) {
          return (uint)yy_action[iVar2];
        }
      }
      pParser_local._4_4_ = (uint)yy_default[(int)uVar1];
    }
    else {
      pParser_local._4_4_ = (uint)yy_action[iVar2];
    }
  }
  else {
    pParser_local._4_4_ = (uint)yy_default[(int)uVar1];
  }
  return pParser_local._4_4_;
}

Assistant:

static int yy_find_shift_action(
  yyParser *pParser,        /* The parser */
  YYCODETYPE iLookAhead     /* The look-ahead token */
){
  int i;
  int stateno = pParser->yystack[pParser->yyidx].stateno;
 
  if( stateno>YY_SHIFT_COUNT
   || (i = yy_shift_ofst[stateno])==YY_SHIFT_USE_DFLT ){
    return yy_default[stateno];
  }
  assert( iLookAhead!=YYNOCODE );
  i += iLookAhead;
  if( i<0 || i>=YY_ACTTAB_COUNT || yy_lookahead[i]!=iLookAhead ){
    if( iLookAhead>0 ){
#ifdef YYFALLBACK
      YYCODETYPE iFallback;            /* Fallback token */
      if( iLookAhead<sizeof(yyFallback)/sizeof(yyFallback[0])
             && (iFallback = yyFallback[iLookAhead])!=0 ){
#ifndef NDEBUG
        if( yyTraceFILE ){
          fprintf(yyTraceFILE, "%sFALLBACK %s => %s\n",
             yyTracePrompt, yyTokenName[iLookAhead], yyTokenName[iFallback]);
        }
#endif
        return yy_find_shift_action(pParser, iFallback);
      }
#endif
#ifdef YYWILDCARD
      {
        int j = i - iLookAhead + YYWILDCARD;
        if( 
#if YY_SHIFT_MIN+YYWILDCARD<0
          j>=0 &&
#endif
#if YY_SHIFT_MAX+YYWILDCARD>=YY_ACTTAB_COUNT
          j<YY_ACTTAB_COUNT &&
#endif
          yy_lookahead[j]==YYWILDCARD
        ){
#ifndef NDEBUG
          if( yyTraceFILE ){
            fprintf(yyTraceFILE, "%sWILDCARD %s => %s\n",
               yyTracePrompt, yyTokenName[iLookAhead], yyTokenName[YYWILDCARD]);
          }
#endif /* NDEBUG */
          return yy_action[j];
        }
      }
#endif /* YYWILDCARD */
    }
    return yy_default[stateno];
  }else{
    return yy_action[i];
  }
}